

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O0

const_iterator __thiscall
QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
::lower_bound(QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
              *this,QPushButton **key)

{
  const_iterator ppQVar1;
  const_iterator ppQVar2;
  undefined8 in_RSI;
  QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
  *in_RDI;
  const_iterator cVar3;
  QVLABase<QPushButton_*> *in_stack_ffffffffffffffc0;
  QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
  *in_stack_ffffffffffffffd8;
  
  ppQVar1 = QVLABase<QPushButton_*>::begin((QVLABase<QPushButton_*> *)0x6725a1);
  ppQVar2 = QVLABase<QPushButton_*>::end(in_stack_ffffffffffffffc0);
  key_comp(in_RDI);
  std::lower_bound<QPushButton*const*,QPushButton*,std::less<QPushButton*>>(ppQVar1,ppQVar2,in_RSI);
  cVar3 = fromKeysIterator(in_stack_ffffffffffffffd8,(const_iterator)in_RDI);
  return cVar3;
}

Assistant:

const_iterator lower_bound(const Key &key) const
    {
        return fromKeysIterator(std::lower_bound(c.keys.begin(), c.keys.end(), key, key_comp()));
    }